

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_interface.cpp
# Opt level: O3

bool ExrInterface::writeFrame(char *outputFile,LumaFrame *frame)

{
  uint uVar1;
  float fVar2;
  short sVar3;
  void *pvVar4;
  undefined8 uVar5;
  LumaException *this;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 local_50;
  RgbaOutputFile file;
  
  if (*(long *)(frame + 0x10) != 0) {
    uVar13 = (ulong)*(uint *)frame;
    uVar1 = *(uint *)(frame + 4);
    uVar8 = (ulong)uVar1;
    pvVar4 = operator_new__(-(ulong)(uVar13 * uVar8 >> 0x3d != 0) | uVar13 * uVar8 * 8);
    if (uVar13 != 0) {
      lVar12 = 0;
      uVar9 = 0;
      do {
        lVar11 = lVar12;
        uVar14 = uVar8;
        if (uVar1 != 0) {
          do {
            lVar6 = *(long *)(frame + 0x10);
            fVar2 = *(float *)(lVar6 + lVar11);
            if ((fVar2 != 0.0) || (NAN(fVar2))) {
              sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar2 >> 0x17) * 2);
              if (sVar3 == 0) {
                sVar3 = half::convert((int)fVar2);
                lVar6 = *(long *)(frame + 0x10);
              }
              else {
                sVar3 = sVar3 + (short)(((uint)fVar2 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar2 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              sVar3 = (short)((uint)fVar2 >> 0x10);
            }
            *(short *)((long)pvVar4 + lVar11 * 2) = sVar3;
            iVar10 = *(int *)frame;
            iVar7 = *(int *)(frame + 4);
            fVar2 = *(float *)(lVar11 + lVar6 + (ulong)(uint)(iVar7 * iVar10) * 4);
            if ((fVar2 != 0.0) || (NAN(fVar2))) {
              sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar2 >> 0x17) * 2);
              if (sVar3 == 0) {
                sVar3 = half::convert((int)fVar2);
                lVar6 = *(long *)(frame + 0x10);
                iVar10 = *(int *)frame;
                iVar7 = *(int *)(frame + 4);
              }
              else {
                sVar3 = sVar3 + (short)(((uint)fVar2 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar2 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              sVar3 = (short)((uint)fVar2 >> 0x10);
            }
            *(short *)((long)pvVar4 + lVar11 * 2 + 2) = sVar3;
            fVar2 = *(float *)(lVar11 + lVar6 + (ulong)(uint)(iVar7 * iVar10 * 2) * 4);
            if ((fVar2 != 0.0) || (NAN(fVar2))) {
              sVar3 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar2 >> 0x17) * 2);
              if (sVar3 == 0) {
                sVar3 = half::convert((int)fVar2);
              }
              else {
                sVar3 = sVar3 + (short)(((uint)fVar2 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar2 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              sVar3 = (short)((uint)fVar2 >> 0x10);
            }
            *(short *)((long)pvVar4 + lVar11 * 2 + 4) = sVar3;
            *(undefined2 *)((long)pvVar4 + lVar11 * 2 + 6) = 0;
            lVar11 = lVar11 + 4;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        uVar9 = uVar9 + 1;
        lVar12 = lVar12 + uVar8 * 4;
      } while (uVar9 != uVar13);
    }
    local_50 = 0;
    uVar5 = Imf_2_5::globalThreadCount();
    Imf_2_5::RgbaOutputFile::RgbaOutputFile(&file,outputFile,uVar8,uVar13,7,&local_50,0,4,uVar5);
    Imf_2_5::RgbaOutputFile::setFrameBuffer((Rgba *)&file,(ulong)pvVar4,1);
    Imf_2_5::RgbaOutputFile::writePixels((int)&file);
    Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&file);
    operator_delete__(pvVar4);
    return true;
  }
  this = (LumaException *)__cxa_allocate_exception(0x28);
  LumaException::LumaException(this,"Frame does not contain any data");
  __cxa_throw(this,&LumaException::typeinfo,LumaException::~LumaException);
}

Assistant:

bool ExrInterface::writeFrame(const char *outputFile, LumaFrame &frame)
{
    if (frame.buffer == NULL)
        throw LumaException("Frame does not contain any data");
    
    try
    {
        unsigned int w = frame.width, h = frame.height;
        Array2D<Rgba> pixels;
        pixels.resizeErase(h, w);
        for (size_t y=0; y<h; y++)
	        for (size_t x=0; x<w; x++)
	        {
	            Rgba &p = pixels[y][x];
	            p.r = frame.getChannel(0)[x+y*w];
	            p.g = frame.getChannel(1)[x+y*w];
	            p.b = frame.getChannel(2)[x+y*w];
	            p.a = 0;
	        }
        
        RgbaOutputFile file(outputFile, w, h, WRITE_RGB);
        file.setFrameBuffer(&pixels[0][0], 1, w);
        file.writePixels(h);
    }
    catch (const std::exception &e)
    {
        throw LumaException(e.what());
    }
    
    return 1;
}